

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O0

void sun_prog_ilopheth(AREA_DATA_conflict *area)

{
  area_data **in_stack_000000a8;
  _func_void_area_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_000000b0;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  undefined4 in_stack_000000c8;
  int in_stack_000000cc;
  CQueue *in_stack_000000d0;
  string *in_stack_000000d8;
  int in_stack_000000ec;
  CQueue *in_stack_000000f0;
  char (*in_stack_00000100) [89];
  allocator<char> local_b1;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  if (sun == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89]>
              (in_stack_000000f0,in_stack_000000ec,(string *)area,in_stack_000000d8,
               (_func_void_area_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)in_stack_000000d0,(area_data **)CONCAT44(in_stack_000000cc,in_stack_000000c8),
               in_stack_00000100);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
  }
  else if (sun == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[66]>
              (in_stack_000000d0,in_stack_000000cc,in_stack_000000c0,in_stack_000000b8,
               in_stack_000000b0,in_stack_000000a8,(char (*) [66])area);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void sun_prog_ilopheth(AREA_DATA *area)
{
	switch (sun)
	{
		case SolarPosition::Sunrise:
			RS.Queue.AddToQueue(15, "sun_prog_ilopheth", "zone_echo_queue", zone_echo_queue, area, "With the beginning of the day sounds of life fill the valley, as the forest comes alive.");
			break;
		case SolarPosition::Sunset:
			RS.Queue.AddToQueue(15, "sun_prog_ilopheth", "zone_echo_queue", zone_echo_queue, area, "The forest grows still, as the night sky settles over the valley.");
			break;
	}
}